

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_internals.c
# Opt level: O3

TA_RetCode circBufferFillFrom0ToSize(int size,int *buffer)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined1 *puVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  undefined1 *__ptr;
  long lVar8;
  int local_MyBuf [4];
  undefined1 local_28 [24];
  
  __ptr = local_28;
  puVar4 = local_28;
  if (size < 5) {
    if (size < 1) {
      bVar1 = false;
      iVar5 = 0;
      iVar7 = 0;
      goto LAB_0011504b;
    }
  }
  else {
    puVar4 = (undefined1 *)malloc((ulong)(uint)size << 2);
    if (puVar4 == (undefined1 *)0x0) {
      return TA_ALLOC_ERR;
    }
  }
  iVar7 = 0;
  iVar5 = 0;
  do {
    *(int *)(puVar4 + (long)iVar5 * 4) = iVar7;
    iVar7 = iVar7 + 1;
    bVar1 = size + -1 <= iVar5;
    iVar5 = iVar5 + 1;
    if (bVar1) {
      iVar5 = 0;
    }
  } while (size != iVar7);
  bVar1 = true;
  __ptr = puVar4;
  iVar7 = size;
LAB_0011504b:
  lVar8 = 0;
  do {
    iVar3 = (int)lVar8;
    buffer[lVar8] = *(int *)(__ptr + (long)iVar5 * 4);
    lVar8 = lVar8 + 1;
    *(int *)(__ptr + (long)iVar5 * 4) = iVar7 + iVar3;
    bVar2 = size + -1 <= iVar5;
    iVar5 = iVar5 + 1;
    if (bVar2) {
      iVar5 = 0;
    }
  } while (lVar8 != 3);
  if (bVar1) {
    uVar6 = 3;
    do {
      buffer[uVar6] = *(int *)(__ptr + (long)iVar5 * 4);
      uVar6 = uVar6 + 1;
      bVar1 = size + -1 <= iVar5;
      iVar5 = iVar5 + 1;
      if (bVar1) {
        iVar5 = 0;
      }
    } while (size + 3 != uVar6);
  }
  if (__ptr != local_28) {
    free(__ptr);
  }
  return TA_SUCCESS;
}

Assistant:

static TA_RetCode circBufferFillFrom0ToSize( int size, int *buffer )
{
   CIRCBUF_PROLOG(MyBuf,int,4);
   int i, value;
   int outIdx;

   CIRCBUF_INIT(MyBuf,int,size);

   outIdx = 0;

   // 1st Loop: Fill MyBuf with initial values
   //           (must be done).
   value = 0;
   for( i=0; i < size; i++ )
   {
      MyBuf[MyBuf_Idx] = value++;
      CIRCBUF_NEXT(MyBuf);
   }

   // 2nd Loop: Get and Add subsequent values
   //           in MyBuf (optional)
   for( i=0; i < 3; i++ )
   {
      buffer[outIdx++] = MyBuf[MyBuf_Idx];
      MyBuf[MyBuf_Idx] = value++;
      CIRCBUF_NEXT(MyBuf);
   }

   // 3rd Loop: Empty MyBuf (optional)
   for( i=0; i < size; i++ )
   {
      buffer[outIdx++] = MyBuf[MyBuf_Idx];
      CIRCBUF_NEXT(MyBuf);
   }

   CIRCBUF_DESTROY(MyBuf);

   return TA_SUCCESS;
}